

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O3

uint8_t * dtl_json_reader_parse_block(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  bstr_context_t *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  undefined8 uVar7;
  dtl_json_readerData_t *pdVar8;
  long lVar9;
  dtl_dv_t *pdVar10;
  ulong uVar11;
  uint local_40 [3];
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  bVar3 = self->parseState;
  if (bVar3 == 0) {
    self->parseState = '\x02';
    bVar3 = 2;
  }
  if (pBegin < pEnd && 1 < bVar3) {
    pbVar1 = &self->ctx;
    do {
      if (8 < bVar3 - 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                      ,0x1e8,
                      "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                     );
      }
      bVar2 = *pBegin;
      switch((uint)bVar3) {
      case 2:
        pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
        self->parseState = '\x03';
        break;
      case 3:
        iVar4 = bstr_pred_is_digit(bVar2);
        pbVar6 = pBegin;
        if ((bVar2 == 0x2d) || (iVar4 != 0)) {
          pbVar5 = (byte *)bstr_parse_json_number(pbVar1,pBegin,pEnd,local_40);
          if (pBegin < pbVar5) {
            if (((local_34 == '\x01') && (local_33 == '\0')) && (local_32 == '\0')) {
              uVar11 = (ulong)local_40[0];
              if (local_31 == '\x01') {
                if ((int)local_40[0] < 0) {
                  pdVar10 = (dtl_dv_t *)dtl_sv_make_i64(-uVar11);
                }
                else {
                  uVar11 = (ulong)-local_40[0];
LAB_00102c72:
                  pdVar10 = (dtl_dv_t *)dtl_sv_make_i32(uVar11);
                }
              }
              else {
                if (-1 < (int)local_40[0]) goto LAB_00102c72;
                pdVar10 = (dtl_dv_t *)dtl_sv_make_u32();
              }
              self->data->currentElem = pdVar10;
              self->parseState = '\x04';
              pbVar6 = pbVar5;
            }
            else {
              self->parseState = '\x01';
            }
          }
        }
        else if (bVar2 < 0x6e) {
          if (bVar2 == 0x22) {
            lVar9 = adt_str_new();
            if (lVar9 != 0) {
              pbVar5 = (byte *)bstr_parse_json_string_literal(pbVar1,pBegin,pEnd,lVar9);
              if (pBegin < pbVar5) {
                pdVar10 = (dtl_dv_t *)dtl_sv_make_str(lVar9);
                self->data->currentElem = pdVar10;
                self->parseState = '\x04';
                pbVar6 = pbVar5;
              }
              adt_str_delete(lVar9);
            }
          }
          else if (bVar2 == 0x5b) {
            pdVar10 = (dtl_dv_t *)dtl_av_new();
            self->data->currentElem = pdVar10;
            if (pdVar10 == (dtl_dv_t *)0x0) {
LAB_00102c1d:
              self->parseState = '\x01';
              self->lastError = 1;
            }
            else {
              self->parseState = '\x05';
LAB_00102be0:
              pbVar6 = pBegin + 1;
            }
          }
          else {
            if (bVar2 != 0x66) goto LAB_00102bbc;
            pbVar5 = (byte *)bstr_match_cstr(pBegin,pEnd,"false");
            if (pBegin < pbVar5) {
              uVar7 = 0;
              goto LAB_00102c08;
            }
          }
        }
        else if (bVar2 == 0x6e) {
          pbVar5 = (byte *)bstr_match_cstr(pBegin,pEnd,"null");
          if (pBegin < pbVar5) {
            self->data->currentElem = (dtl_dv_t *)&g_dtl_sv_none;
            self->parseState = '\x04';
            pbVar6 = pbVar5;
          }
        }
        else if (bVar2 == 0x74) {
          pbVar5 = (byte *)bstr_match_cstr(pBegin,pEnd,"true");
          if (pBegin < pbVar5) {
            uVar7 = 1;
LAB_00102c08:
            pdVar10 = (dtl_dv_t *)dtl_sv_make_bool(uVar7);
            self->data->currentElem = pdVar10;
            self->parseState = '\x04';
            pbVar6 = pbVar5;
          }
        }
        else {
          if (bVar2 == 0x7b) {
            pdVar10 = (dtl_dv_t *)dtl_hv_new();
            self->data->currentElem = pdVar10;
            if (pdVar10 == (dtl_dv_t *)0x0) goto LAB_00102c1d;
            self->parseState = '\a';
            goto LAB_00102be0;
          }
LAB_00102bbc:
          self->parseState = '\x01';
          self->lastError = 2;
        }
        if (pBegin < pbVar6) {
          pBegin = pbVar6;
        }
        break;
      case 4:
        pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
        pdVar8 = self->data;
        if (pdVar8->isArray == true) {
          if (pdVar8->parentElem == (dtl_dv_t *)0x0) {
            __assert_fail("self->data->parentElem != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                          ,0x13b,
                          "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          dtl_av_push(pdVar8->parentElem,pdVar8->currentElem,0);
          self->data->currentElem = (dtl_dv_t *)0x0;
          self->parseState = '\x06';
        }
        else if (pdVar8->isObject == true) {
          pdVar10 = pdVar8->parentElem;
          if (pdVar10 == (dtl_dv_t *)0x0) {
            __assert_fail("self->data->parentElem != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                          ,0x142,
                          "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          uVar7 = adt_str_cstr(&pdVar8->objectKey);
          dtl_hv_set_cstr(pdVar10,uVar7,self->data->currentElem,0);
          pdVar8 = self->data;
          pdVar8->currentElem = (dtl_dv_t *)0x0;
          adt_str_clear(&pdVar8->objectKey);
          self->parseState = '\n';
        }
        else {
          self->parseState = '\0';
        }
        break;
      case 5:
        pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
        if (pBegin < pEnd) {
          if (*pBegin == 0x5d) {
LAB_001028f4:
            self->parseState = '\x04';
            pBegin = pBegin + 1;
          }
          else {
            pdVar8 = dtl_json_readerData_new();
            if (pdVar8 == (dtl_json_readerData_t *)0x0) {
LAB_00102b10:
              self->parseState = '\x01';
              self->lastError = 1;
            }
            else {
              pdVar8->isArray = true;
              pdVar8->parentElem = self->data->currentElem;
              adt_stack_push(self);
              self->data = pdVar8;
              self->parseState = '\x02';
            }
          }
        }
        break;
      case 6:
        if (bVar2 == 0x5d) {
          dtl_dv_inc_ref(self->data->currentElem);
          dtl_json_readerData_delete(self->data);
          iVar4 = adt_stack_size(self);
          if (iVar4 == 0) {
            __assert_fail("adt_stack_size(&self->stack) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                          ,0x177,
                          "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                         );
          }
LAB_00102a6d:
          pdVar8 = (dtl_json_readerData_t *)adt_stack_top(self);
          self->data = pdVar8;
          adt_stack_pop(self);
          self->parseState = '\x04';
          pBegin = pBegin + 1;
        }
        else {
          if (bVar2 == 0x2c) goto LAB_0010285a;
LAB_00102982:
          self->parseState = '\x01';
          self->lastError = 2;
        }
        break;
      case 7:
        pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
        if (pBegin < pEnd) {
          if (*pBegin == 0x7d) goto LAB_001028f4;
          pdVar8 = dtl_json_readerData_new();
          if (pdVar8 == (dtl_json_readerData_t *)0x0) goto LAB_00102b10;
          pdVar8->isObject = true;
          pdVar8->parentElem = self->data->currentElem;
          adt_stack_push(self);
          self->data = pdVar8;
          self->parseState = '\b';
        }
        break;
      case 8:
        pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
        if (pBegin < pEnd) {
          if (*pBegin == 0x22) {
            pbVar6 = (byte *)bstr_parse_json_string_literal
                                       (pbVar1,pBegin,pEnd,&self->data->objectKey);
            if (pBegin < pbVar6) {
              iVar4 = adt_str_length(&self->data->objectKey);
              pBegin = pbVar6;
              if (iVar4 == 0) {
                self->parseState = '\x01';
                self->lastError = 4;
              }
              else {
                self->parseState = '\t';
              }
            }
            else {
              self->parseState = '\x01';
              self->lastError = 5;
            }
          }
          else {
            self->parseState = '\x01';
            self->lastError = 2;
          }
        }
        break;
      case 9:
        pBegin = dtl_json_reader_lstrip(self,pBegin,pEnd);
        if ((pBegin < pEnd) && (*pBegin == 0x3a)) {
LAB_0010285a:
          self->parseState = '\x02';
          pBegin = pBegin + 1;
        }
        break;
      case 10:
        if (bVar2 == 0x7d) {
          dtl_dv_inc_ref(self->data->currentElem);
          dtl_json_readerData_delete(self->data);
          iVar4 = adt_stack_size(self);
          if (iVar4 == 0) {
            __assert_fail("adt_stack_size(&self->stack) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_reader.c"
                          ,0x1dc,
                          "const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          goto LAB_00102a6d;
        }
        if (bVar2 != 0x2c) goto LAB_00102982;
        self->parseState = '\b';
        pBegin = pBegin + 1;
      }
      bVar3 = self->parseState;
    } while ((1 < bVar3) && (pBegin < pEnd));
  }
  if (bVar3 == 1) {
    dtl_av_delete(self->data->currentElem);
  }
  return pBegin;
}

Assistant:

static const uint8_t *dtl_json_reader_parse_block(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;

   if (self->parseState == PARSE_STATE_NONE)
   {
      self->parseState = PARSE_STATE_PRE_VALUE;
   }
   while( (self->parseState != PARSE_STATE_NONE) && (self->parseState != PARSE_STATE_ERROR) && (pNext < pEnd) )
   {
      const uint8_t *pResult;
      uint8_t nextChar = *pNext;

      switch(self->parseState)
      {
      case PARSE_STATE_PRE_VALUE:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         self->parseState = PARSE_STATE_VALUE;
         break;
      case PARSE_STATE_VALUE:
         pResult = dtl_json_reader_parse_value(self, pNext, pEnd);
         if (pResult > pNext)
         {
            pNext = pResult;
         }
         break;
      case PARSE_STATE_POST_VALUE:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if (self->data->isArray)
         {
            assert(self->data->parentElem != 0);
            dtl_av_push((dtl_av_t*) self->data->parentElem, self->data->currentElem, false);
            self->data->currentElem = (dtl_dv_t*) 0;
            self->parseState = PARSE_STATE_ARRAY_NEXT;
         }
         else if (self->data->isObject)
         {
            assert(self->data->parentElem != 0);
            dtl_hv_set_cstr((dtl_hv_t*) self->data->parentElem, adt_str_cstr(&self->data->objectKey), self->data->currentElem, false);
            self->data->currentElem = (dtl_dv_t*) 0;
            adt_str_clear(&self->data->objectKey);
            self->parseState = PARSE_STATE_OBJECT_NEXT;
         }
         else
         {
            self->parseState = PARSE_STATE_NONE;
         }
         break;
      case PARSE_STATE_ARRAY_BEGIN:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar==']')
            {
               //empty array, no need to create child state
               self->parseState = PARSE_STATE_POST_VALUE;
               pNext++;
            }
            else
            {
               //non-empty array, push current data and initiate child state
               dtl_json_readerData_t *childData = dtl_json_readerData_new();
               if (childData != 0)
               {
                  childData->isArray = true;
                  childData->parentElem = self->data->currentElem;
                  adt_stack_push(&self->stack, self->data);
                  self->data = childData;
                  self->parseState = PARSE_STATE_PRE_VALUE;
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_MEM_ERROR;
               }
            }
         }
         break;
      case PARSE_STATE_ARRAY_NEXT:
         if (nextChar == ',')
         {
            pNext++;
            self->parseState = PARSE_STATE_PRE_VALUE;
         }
         else if(nextChar == ']')
         {
            pNext++;
            dtl_dv_inc_ref(self->data->currentElem);
            dtl_json_readerData_delete(self->data);
            assert(adt_stack_size(&self->stack) > 0);
            self->data = adt_stack_top(&self->stack);
            adt_stack_pop(&self->stack);
            self->parseState = PARSE_STATE_POST_VALUE;
         }
         else
         {
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
         break;
      case PARSE_STATE_OBJECT_BEGIN:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar=='}')
            {
               //empty object, no need to create child state
               self->parseState = PARSE_STATE_POST_VALUE;
               pNext++;
            }
            else
            {
               //non-empty array, push current data and initiate child state
               dtl_json_readerData_t *childData = dtl_json_readerData_new();
               if (childData != 0)
               {
                  childData->isObject = true;
                  childData->parentElem = self->data->currentElem;
                  adt_stack_push(&self->stack, self->data);
                  self->data = childData;
                  self->parseState = PARSE_STATE_OBJECT_KEY;
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_MEM_ERROR;
               }
            }
         }
         break;
      case PARSE_STATE_OBJECT_KEY:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar=='"')
            {
               const uint8_t *pInnerResult;
               pInnerResult = bstr_parse_json_string_literal(&self->ctx, pNext, pEnd, &self->data->objectKey);
               if (pInnerResult > pNext)
               {
                  pNext = pInnerResult;
                  if (adt_str_length(&self->data->objectKey) == 0)
                  {
                     self->parseState = PARSE_STATE_ERROR;
                     self->lastError = DTL_JSON_EMPTY_KEY_ERROR;
                  }
                  else
                  {
                     self->parseState = PARSE_STATE_OBJECT_SEP;
                  }
               }
               else
               {
                  self->parseState = PARSE_STATE_ERROR;
                  self->lastError = DTL_JSON_UNMATCHED_STRING_LITERAL;
               }
            }
            //TODO: We should probably allow stray comma here to make it easier for the user
            else
            {
               self->parseState = PARSE_STATE_ERROR;
               self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
            }
         }
         break;
      case PARSE_STATE_OBJECT_SEP:
         pNext = dtl_json_reader_lstrip(self, pNext, pEnd);
         if ( pNext < pEnd)
         {
            nextChar = *pNext;
            if (nextChar==':')
            {
               pNext++;
               self->parseState = PARSE_STATE_PRE_VALUE;
            }
         }
         break;
      case PARSE_STATE_OBJECT_NEXT:
         if (nextChar == ',')
         {
            pNext++;
            self->parseState = PARSE_STATE_OBJECT_KEY;
         }
         else if(nextChar == '}')
         {
            pNext++;
            dtl_dv_inc_ref(self->data->currentElem);
            dtl_json_readerData_delete(self->data);
            assert(adt_stack_size(&self->stack) > 0);
            self->data = adt_stack_top(&self->stack);
            adt_stack_pop(&self->stack);
            self->parseState = PARSE_STATE_POST_VALUE;
         }
         else
         {
            self->parseState = PARSE_STATE_ERROR;
            self->lastError = DTL_JSON_UNEXPECTED_CHAR_ERROR;
         }
         break;
      default:
         assert(0);
      }
   }
   if (self->parseState == PARSE_STATE_ERROR)
   {
      dtl_av_delete((dtl_av_t*) self->data->currentElem);
   }
   return pNext;
}